

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool IsWindowContentHoverable(ImGuiWindow *window)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *focused_root_window;
  ImGuiWindow *focused_window;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  if ((((GImGui->FocusedWindow == (ImGuiWindow *)0x0) ||
       (pIVar1 = GImGui->FocusedWindow->RootWindow, pIVar1 == (ImGuiWindow *)0x0)) ||
      ((pIVar1->Flags & 0x2000000U) == 0)) ||
     (((pIVar1->WasActive & 1U) == 0 || (pIVar1 == window->RootWindow)))) {
    window_local._7_1_ = true;
  }
  else {
    window_local._7_1_ = false;
  }
  return window_local._7_1_;
}

Assistant:

static inline bool IsWindowContentHoverable(ImGuiWindow* window)
{
    // An active popup disable hovering on other windows (apart from its own children)
    ImGuiContext& g = *GImGui;
    if (ImGuiWindow* focused_window = g.FocusedWindow)
        if (ImGuiWindow* focused_root_window = focused_window->RootWindow)
            if ((focused_root_window->Flags & ImGuiWindowFlags_Popup) != 0 && focused_root_window->WasActive && focused_root_window != window->RootWindow)
                return false;

    return true;
}